

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.cc
# Opt level: O3

int main(int argc,char **argv)

{
  uint64_t *puVar1;
  KVStore *this;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  char *mode;
  char *verb;
  char *prog;
  bool bVar5;
  bool bVar6;
  bool testmode;
  PersistenceTest test;
  undefined1 local_93;
  allocator<char> local_92;
  allocator<char> local_91;
  string local_90;
  PersistenceTest local_70;
  
  local_93 = 0;
  if (argc == 3) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,argv[1],&local_91);
    iVar2 = std::__cxx11::string::compare((char *)&local_70);
    if (iVar2 == 0) {
      bVar6 = true;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,argv[2],&local_92);
      iVar2 = std::__cxx11::string::compare((char *)&local_90);
      bVar6 = iVar2 == 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    puVar1 = &local_70.super_Test.nr_passed_tests;
    if (local_70.super_Test._vptr_Test != (_func_int **)puVar1) {
      operator_delete(local_70.super_Test._vptr_Test,local_70.super_Test.nr_passed_tests + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,argv[1],&local_91);
    iVar2 = std::__cxx11::string::compare((char *)&local_70);
    if (iVar2 == 0) {
      local_93 = 1;
      bVar5 = true;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,argv[2],&local_92);
      iVar2 = std::__cxx11::string::compare((char *)&local_90);
      bVar5 = iVar2 == 0;
      local_93 = bVar5;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_70.super_Test._vptr_Test != (_func_int **)puVar1) {
      operator_delete(local_70.super_Test._vptr_Test,local_70.super_Test.nr_passed_tests + 1);
    }
    prog = *argv;
    if (!bVar6) goto LAB_00103efd;
  }
  else {
    if (argc != 2) {
      if (3 < argc) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Too many arguments.");
        std::endl<char,std::char_traits<char>>(poVar4);
        usage(*argv,"OFF","Preparation Mode");
        exit(-1);
      }
      prog = *argv;
      bVar5 = false;
LAB_00103efd:
      verb = "OFF";
      bVar6 = false;
      goto LAB_00103eff;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,argv[1],(allocator<char> *)&local_90);
    iVar2 = std::__cxx11::string::compare((char *)&local_70);
    puVar1 = &local_70.super_Test.nr_passed_tests;
    if (local_70.super_Test._vptr_Test != (_func_int **)puVar1) {
      operator_delete(local_70.super_Test._vptr_Test,local_70.super_Test.nr_passed_tests + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,argv[1],(allocator<char> *)&local_90);
    iVar3 = std::__cxx11::string::compare((char *)&local_70);
    bVar5 = iVar3 == 0;
    local_93 = bVar5;
    if (local_70.super_Test._vptr_Test != (_func_int **)puVar1) {
      operator_delete(local_70.super_Test._vptr_Test,local_70.super_Test.nr_passed_tests + 1);
    }
    prog = *argv;
    if (iVar2 != 0) {
      bVar6 = false;
      verb = "OFF";
      goto LAB_00103eff;
    }
  }
  verb = "ON";
  bVar6 = true;
LAB_00103eff:
  mode = "Preparation Mode";
  if (bVar5) {
    mode = "Test Mode";
  }
  usage(prog,verb,mode);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"./data","");
  this = &local_70.super_Test.store;
  local_70.super_Test._vptr_Test = (_func_int **)&PTR_start_test_00110c18;
  KVStore::KVStore(this,&local_90);
  local_70.super_Test.nr_tests = 0;
  local_70.super_Test.nr_passed_tests = 0;
  local_70.super_Test.nr_phases = 0;
  local_70.super_Test.nr_passed_phases = 0;
  local_70.super_Test._vptr_Test = (_func_int **)&PTR_start_test_00110bd8;
  local_70.TEST_MAX = 0x8000;
  local_70.super_Test.verbose = bVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  PersistenceTest::start_test(&local_70,&local_93);
  local_70.super_Test._vptr_Test = (_func_int **)&PTR_start_test_00110c18;
  KVStore::~KVStore(this);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    bool verbose = false;
    bool testmode = false;

    if (argc == 2) {
        verbose = std::string(argv[1]) == "-v";
        testmode = std::string(argv[1]) == "-t";
    } else if (argc == 3) {
        verbose = std::string(argv[1]) == "-v" ||
                  std::string(argv[2]) == "-v";
        testmode = std::string(argv[1]) == "-t" ||
                   std::string(argv[2]) == "-t";
    } else if (argc > 3) {
        std::cerr << "Too many arguments." << std::endl;
        usage(argv[0], "OFF", "Preparation Mode");
        exit(-1);
    }
    usage(argv[0], verbose ? "ON" : "OFF",
          testmode ? "Test Mode" : "Preparation Mode");

    PersistenceTest test("./data", verbose);

    test.start_test(static_cast<void *>(&testmode));

    return 0;
}